

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> * __thiscall
Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::operator=
          (RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *this,
          ShaderResourceBindingVkImpl *pObj)

{
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *pRVar1;
  RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> local_20;
  
  RefCntWeakPtr(&local_20,pObj);
  pRVar1 = operator=(this,&local_20);
  Release(&local_20);
  return pRVar1;
}

Assistant:

RefCntWeakPtr& operator=(T* pObj) noexcept
    {
        return operator=(RefCntWeakPtr(pObj));
    }